

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextedit.cpp
# Opt level: O2

void __thiscall QTextEdit::setAlignment(QTextEdit *this,Alignment a)

{
  QTextEditPrivate *this_00;
  long in_FS_OFFSET;
  QTextCursor cursor;
  undefined1 *local_40;
  undefined1 *local_38;
  undefined1 *puStack_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QTextEditPrivate **)
             &(this->super_QAbstractScrollArea).super_QFrame.super_QWidget.field_0x8;
  local_38 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_30 = &DAT_aaaaaaaaaaaaaaaa;
  QTextBlockFormat::QTextBlockFormat((QTextBlockFormat *)&local_38);
  QTextBlockFormat::setAlignment((QTextBlockFormat *)&local_38,a);
  local_40 = &DAT_aaaaaaaaaaaaaaaa;
  QWidgetTextControl::textCursor((QWidgetTextControl *)&local_40);
  QTextCursor::mergeBlockFormat((QTextBlockFormat *)&local_40);
  QWidgetTextControl::setTextCursor
            ((QWidgetTextControl *)this_00->control,(QTextCursor *)&local_40,false);
  QTextEditPrivate::relayoutDocument(this_00);
  QTextCursor::~QTextCursor((QTextCursor *)&local_40);
  QTextFormat::~QTextFormat((QTextFormat *)&local_38);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTextEdit::setAlignment(Qt::Alignment a)
{
    Q_D(QTextEdit);
    QTextBlockFormat fmt;
    fmt.setAlignment(a);
    QTextCursor cursor = d->control->textCursor();
    cursor.mergeBlockFormat(fmt);
    d->control->setTextCursor(cursor);
    d->relayoutDocument();
}